

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void loop(void)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  int *piVar4;
  string local_30;
  
  vera::updateGL();
  glClear(0x4100);
  if (((bTerminate != false) || (bRunAtFullFps != false)) ||
     (bVar1 = Sandbox::haveChange(&sandbox), bVar1)) {
    Sandbox::renderPrep(&sandbox);
    Sandbox::render(&sandbox);
    Sandbox::renderPost(&sandbox);
    Sandbox::renderUI(&sandbox);
    Sandbox::renderDone(&sandbox);
    if ((bTerminate == true) &&
       (iVar2 = std::__cxx11::string::compare((char *)&sandbox.screenshotFile), iVar2 == 0)) {
      LOCK();
      bKeepRunnig._M_base._M_i = (__atomic_base<bool>)false;
      UNLOCK();
    }
    else if (sandbox.uniforms.tracker.m_running == true) {
      local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"render:swap","");
      Tracker::begin(&sandbox.uniforms.tracker,&local_30);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_30._M_dataplus._M_p != &local_30.field_2) {
        operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
      }
    }
    vera::renderGL();
    if (sandbox.uniforms.tracker.m_running == true) {
      local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"render:swap","");
      Tracker::end(&sandbox.uniforms.tracker,&local_30);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_30._M_dataplus._M_p != &local_30.field_2) {
        operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
      }
    }
  }
  else {
    uVar3 = vera::getRestMs();
    if (0 < (int)uVar3) {
      local_30._M_dataplus._M_p = (pointer)((ulong)uVar3 / 1000);
      local_30._M_string_length = ((ulong)uVar3 % 1000) * 1000000;
      do {
        iVar2 = nanosleep((timespec *)&local_30,(timespec *)&local_30);
        if (iVar2 != -1) {
          return;
        }
        piVar4 = __errno_location();
      } while (*piVar4 == 4);
    }
  }
  return;
}

Assistant:

void loop() {
#endif

    // update time/delta/date and input events
    vera::updateGL();
    glClear( GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT );

    #ifdef __EMSCRIPTEN__
    // Excecute commands in the main loop in WASM/EMSCRIPTEN project because there is no multiple threads
    if (sandbox.isReady() && commandsArgs.size() > 0) {
        for (size_t i = 0; i < commandsArgs.size(); i++)
            commandsRun(commandsArgs[i]);
        commandsArgs.clear();
    }
    #else
    // If nothing in the scene change skip the frame and try to keep it at 60fps
    if (!bTerminate && !bRunAtFullFps && !sandbox.haveChange()) {
        std::this_thread::sleep_for(std::chrono::milliseconds( vera::getRestMs() ));
        return;
    }
    #endif

    // PREP for main render:
    //  - update uniforms
    //  - render buffers, double buffers and pyramid convolutions
    //  - render lighmaps (3D scenes only)
    //  - render normal/possition/extra g buffers (3D scenes only)
    //  - start the recording FBO (when recording)
    sandbox.renderPrep();

    // Render the main 2D Shader on a billboard or 3D Scene when there is geometry models
    // Note: if the render require multiple views of the render (for quilts or VR) it happens here.
    sandbox.render();

    // POST render:
    //  - post-processing render pass
    //  - close recording FBO (when recording)
    sandbox.renderPost();

    // UI render pass:
    //  - draw textures (debug)
    //  - draw render passes/buffers (debug)
    //  - draw plot widget (debug)
    //  - draw cursor
    //  - draw help prompt
    sandbox.renderUI();

    // Finish rendering triggering some events like
    //  - save image/frame if it's needed
    //  - anouncing the first pass have been made
    sandbox.renderDone();

#ifndef __EMSCRIPTEN__
    if ( bTerminate && sandbox.screenshotFile == "" )
        bKeepRunnig.store(false);
    else
#endif
    
    // Swap GL buffer
    TRACK_BEGIN("render:swap")
    vera::renderGL();
    TRACK_END("render:swap")

    #if defined(__EMSCRIPTEN__)
    return (vera::getXR() == vera::NONE_XR_MODE);
    #endif
}